

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void WriteArrayVars(FILE *file,FWorldGlobalArray *vars,uint count,DWORD id)

{
  hash_t hVar1;
  int *piVar2;
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *pTVar3;
  ulong uVar4;
  long lVar5;
  uint count_00;
  ulong uVar6;
  FWorldGlobalArray *this;
  FPNGChunkArchive arc;
  FPNGChunkArchive local_330;
  
  if (count == 0) {
    return;
  }
  uVar6 = 0;
  this = vars;
  while (hVar1 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(this), hVar1 == 0) {
    uVar6 = uVar6 + 1;
    this = this + 1;
    if (count == uVar6) {
      return;
    }
  }
  uVar4 = (ulong)(count - 1);
  pTVar3 = vars + uVar4;
  do {
    count_00 = (uint)uVar4;
    if (count_00 <= (uint)uVar6) break;
    hVar1 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(pTVar3);
    pTVar3 = pTVar3 + -1;
    uVar4 = (ulong)(count_00 - 1);
  } while (hVar1 == 0);
  FPNGChunkArchive::FPNGChunkArchive(&local_330,file,id);
  FArchive::WriteCount(&local_330.super_FArchive,(uint)uVar6);
  FArchive::WriteCount(&local_330.super_FArchive,count_00);
  do {
    if (count_00 < (uint)uVar6) {
      FPNGChunkArchive::~FPNGChunkArchive(&local_330);
      return;
    }
    pTVar3 = vars + (uVar6 & 0xffffffff);
    hVar1 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(pTVar3);
    FArchive::WriteCount(&local_330.super_FArchive,hVar1);
    uVar4 = 0;
    while( true ) {
      if (pTVar3->Size <= (uint)uVar4) break;
      piVar2 = &pTVar3->Nodes[uVar4].Pair.Value;
      lVar5 = 0;
      while (*(long *)(piVar2 + -3) == 1) {
        lVar5 = lVar5 + -1;
        piVar2 = piVar2 + 4;
        if (uVar4 - pTVar3->Size == lVar5) goto LAB_00500b4f;
      }
      FArchive::WriteCount(&local_330.super_FArchive,((IPair *)(piVar2 + -1))->Key);
      uVar4 = (ulong)(((uint)uVar4 - (int)lVar5) + 1);
      FArchive::WriteCount(&local_330.super_FArchive,*piVar2);
    }
LAB_00500b4f:
    uVar6 = (ulong)((uint)uVar6 + 1);
  } while( true );
}

Assistant:

static void WriteArrayVars (FILE *file, FWorldGlobalArray *vars, unsigned int count, DWORD id)
{
	unsigned int i, j;

	// Find the first non-empty array.
	for (i = 0; i < count; ++i)
	{
		if (vars[i].CountUsed() != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-empty array. Anything beyond the last stored array
		// will be emptied at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j].CountUsed() != 0)
				break;
		}
		FPNGChunkArchive arc (file, id);
		arc.WriteCount (i);
		arc.WriteCount (j);
		for (; i <= j; ++i)
		{
			arc.WriteCount (vars[i].CountUsed());

			FWorldGlobalArray::ConstIterator it(vars[i]);
			const FWorldGlobalArray::Pair *pair;

			while (it.NextPair (pair))
			{
				arc.WriteCount (pair->Key);
				arc.WriteCount (pair->Value);
			}
		}
	}
}